

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-prepare.c
# Opt level: O2

int run_test_pipe_connect_on_prepare(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&pipe_handle,0);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_prepare_init(puVar2,&prepare_handle);
    if (iVar1 == 0) {
      iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
      if (iVar1 == 0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
        if (iVar1 == 0) {
          if (close_cb_called == 2) {
            if (connect_cb_called == 1) {
              puVar2 = uv_default_loop();
              uv_walk(puVar2,close_walk_cb,(void *)0x0);
              uv_run(puVar2,UV_RUN_DEFAULT);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar3 = "0 == uv_loop_close(uv_default_loop())";
              uStack_10 = 0x51;
            }
            else {
              pcVar3 = "connect_cb_called == 1";
              uStack_10 = 0x4f;
            }
          }
          else {
            pcVar3 = "close_cb_called == 2";
            uStack_10 = 0x4e;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_10 = 0x4c;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_10 = 0x49;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_10 = 0x47;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_10 = 0x44;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-prepare.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(pipe_connect_on_prepare) {
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe_handle, 0);
  ASSERT(r == 0);

  r = uv_prepare_init(uv_default_loop(), &prepare_handle);
  ASSERT(r == 0);
  r = uv_prepare_start(&prepare_handle, prepare_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 2);
  ASSERT(connect_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}